

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
::remove_value(btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
               *this,int i,allocator_type *alloc)

{
  int i_00;
  int32 iVar1;
  int32 iVar2;
  bool bVar3;
  byte bVar4;
  field_type fVar5;
  slot_type *dest;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
  *pbVar6;
  slot_type *psVar7;
  slot_type *psVar8;
  slot_type *psVar9;
  template_ElementType<1L> *ptVar10;
  slot_type *src;
  long lVar11;
  
  bVar3 = leaf(this);
  if (!bVar3) {
    bVar4 = count(this);
    i_00 = i + 1;
    if (i_00 < (int)(uint)bVar4) {
      pbVar6 = child(this,i_00);
      fVar5 = count(pbVar6);
      if (fVar5 != '\0') {
        __assert_fail("child(i + 1)->count() == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                      ,0x5ec,
                      "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>, 256, false>>::remove_value(const int, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>, 256, false>]"
                     );
      }
      for (lVar11 = (long)i_00; bVar4 = count(this), lVar11 < (long)(ulong)bVar4;
          lVar11 = lVar11 + 1) {
        pbVar6 = child(this,(int)lVar11 + 1);
        set_child(this,(int)lVar11,pbVar6);
      }
      count(this);
      btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,256,false>>
      ::GetField<3l>((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,256,false>>
                      *)this);
    }
  }
  psVar7 = slot(this,i + 1);
  bVar4 = count(this);
  psVar8 = slot(this,(uint)bVar4);
  psVar9 = slot(this,i);
  for (; psVar7 != psVar8; psVar7 = psVar7 + 1) {
    iVar1 = (psVar7->value).shape_id_;
    iVar2 = (psVar7->value).edge_id_;
    (psVar9->value).distance_.distance_.length2_ = (psVar7->value).distance_.distance_.length2_;
    (psVar9->value).shape_id_ = iVar1;
    (psVar9->value).edge_id_ = iVar2;
    psVar9 = psVar9 + 1;
  }
  bVar4 = count(this);
  value_destroy(this,(ulong)bVar4 - 1,alloc);
  fVar5 = count(this);
  ptVar10 = btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,256,false>>
            ::GetField<1l>((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,256,false>>
                            *)this);
  ptVar10[2] = fVar5 + 0xff;
  return;
}

Assistant:

inline void btree_node<P>::remove_value(const int i, allocator_type *alloc) {
  if (!leaf() && count() > i + 1) {
    assert(child(i + 1)->count() == 0);
    for (size_type j = i + 1; j < count(); ++j) {
      set_child(j, child(j + 1));
    }
    clear_child(count());
  }

  slot_type::move(alloc, slot(i + 1), slot(count()), slot(i));
  value_destroy(count() - 1, alloc);
  set_count(count() - 1);
}